

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateMethods
          (EnumGenerator *this,int idx,Printer *printer)

{
  _Rb_tree_node_base *args_2;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  FileOptions_OptimizeMode FVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  EnumDescriptor *pEVar9;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *descriptor;
  EnumValueDescriptor *extraout_RDX_02;
  EnumValueDescriptor *extraout_RDX_03;
  EnumValueDescriptor *extraout_RDX_04;
  EnumValueDescriptor *enum_value;
  long lVar11;
  long lVar12;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar13;
  undefined1 auVar14 [16];
  int data_index;
  int i;
  Formatter format;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  name_to_number;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  number_to_canonical_name;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> number_to_index;
  set<int,_std::less<int>,_std::allocator<int>_> numbers;
  int local_140;
  int local_13c;
  _Base_ptr local_138;
  int local_12c;
  Formatter local_128;
  undefined1 local_f0 [32];
  _Rb_tree_node_base *local_d0;
  size_t local_c8;
  undefined1 local_c0 [32];
  _Base_ptr local_a0;
  size_t local_98;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_12c = idx;
  local_128.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_128.vars_._M_t,&(this->variables_)._M_t);
  FVar4 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_,(bool *)0x0);
  if (FVar4 != FileOptions_OptimizeMode_LITE_RUNTIME) {
    Formatter::operator()
              (&local_128,
               "const ::$proto_ns$::EnumDescriptor* $classname$_descriptor() {\n  ::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n  return $file_level_enum_descriptors$[$1$];\n}\n"
               ,&local_12c);
  }
  Formatter::operator()<>(&local_128,"bool $classname$_IsValid(int value) {\n  switch (value) {\n");
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pEVar9 = this->descriptor_;
  uVar10 = extraout_RDX;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (0 < *(int *)(pEVar9 + 4)) {
    lVar12 = 4;
    lVar11 = 0;
    do {
      local_f0._0_4_ = *(int *)(*(long *)(pEVar9 + 0x28) + lVar12);
      pVar13 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               _M_insert_unique<int>(&local_60,(int *)local_f0);
      uVar10 = pVar13._8_8_;
      lVar11 = lVar11 + 1;
      pEVar9 = this->descriptor_;
      lVar12 = lVar12 + 0x20;
    } while (lVar11 < *(int *)(pEVar9 + 4));
  }
  auVar14._8_8_ = uVar10;
  auVar14._0_8_ = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    do {
      Int32ToString_abi_cxx11_
                ((string *)local_f0,(cpp *)(ulong)auVar14._0_8_[1]._M_color,auVar14._8_4_);
      Formatter::operator()(&local_128,"    case $1$:\n",(string *)local_f0);
      if ((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_) != local_f0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_));
      }
      auVar14 = std::_Rb_tree_increment(auVar14._0_8_);
    } while ((_Rb_tree_header *)auVar14._0_8_ != p_Var2);
  }
  Formatter::operator()<>
            (&local_128,"      return true;\n    default:\n      return false;\n  }\n}\n\n");
  FVar4 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_,(bool *)0x0);
  descriptor = extraout_RDX_00;
  if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    local_f0._24_8_ = local_f0 + 8;
    local_f0._8_4_ = _S_red;
    local_f0._16_8_ = 0;
    local_c8 = 0;
    local_c0._24_8_ = local_c0 + 8;
    local_c0._8_4_ = _S_red;
    local_c0._16_8_ = (_Base_ptr)0x0;
    local_98 = 0;
    pEVar9 = this->descriptor_;
    local_d0 = (_Rb_tree_node_base *)local_f0._24_8_;
    local_a0 = (_Base_ptr)local_c0._24_8_;
    if (0 < *(int *)(pEVar9 + 4)) {
      lVar11 = 8;
      lVar12 = 0;
      do {
        lVar3 = *(long *)(pEVar9 + 0x28);
        local_90._M_impl._0_4_ = *(undefined4 *)(lVar3 + -4 + lVar11);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,int>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    *)local_f0,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar3 + lVar11),(int *)&local_90);
        local_90._M_impl._0_4_ = *(int *)(lVar3 + -4 + lVar11);
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<int,std::__cxx11::string_const&>
                  ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    *)local_c0,(int *)&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar3 + lVar11));
        lVar12 = lVar12 + 1;
        pEVar9 = this->descriptor_;
        lVar11 = lVar11 + 0x20;
      } while (lVar12 < *(int *)(pEVar9 + 4));
    }
    local_90._M_impl._0_4_ = anon_unknown_6::CountUniqueValues(pEVar9);
    Formatter::operator()
              (&local_128,
               "static ::$proto_ns$::internal::ExplicitlyConstructed<std::string> $classname$_strings[$1$] = {};\n\n"
               ,(int *)&local_90);
    Formatter::operator()<>(&local_128,"static const char $classname$_names[] =");
    p_Var1 = (_Rb_tree_node_base *)(local_f0 + 8);
    if ((_Rb_tree_node_base *)local_f0._24_8_ != p_Var1) {
      p_Var6 = (_Rb_tree_node_base *)local_f0._24_8_;
      do {
        Formatter::operator()
                  (&local_128,"\n  \"$1$\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1)
                  );
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != p_Var1);
    }
    Formatter::operator()<>(&local_128,";\n\n");
    Formatter::operator()<>
              (&local_128,
               "static const ::$proto_ns$::internal::EnumEntry $classname$_entries[] = {\n");
    local_13c = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_140 = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_node_base *)local_f0._24_8_ != p_Var1) {
      p_Var6 = (_Rb_tree_node_base *)local_f0._24_8_;
      do {
        local_138 = p_Var6[1]._M_parent;
        args_2 = p_Var6 + 2;
        Formatter::operator()
                  (&local_128,"  { {$classname$_names + $1$, $2$}, $3$ },\n",&local_140,
                   (unsigned_long *)&local_138,(int *)args_2);
        pmVar7 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_c0,(key_type *)args_2);
        p_Var8 = (_Base_ptr)pmVar7->_M_string_length;
        if (p_Var8 == p_Var6[1]._M_parent) {
          if (p_Var8 != (_Base_ptr)0x0) {
            iVar5 = bcmp((pmVar7->_M_dataplus)._M_p,*(void **)(p_Var6 + 1),(size_t)p_Var8);
            if (iVar5 != 0) goto LAB_002dfb8c;
          }
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::_M_emplace_unique<int_const&,int&>
                    ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                      *)&local_90,(int *)args_2,&local_13c);
        }
LAB_002dfb8c:
        local_13c = local_13c + 1;
        local_140 = local_140 + *(int *)&p_Var6[1]._M_parent;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != p_Var1);
    }
    Formatter::operator()<>
              (&local_128,"};\n\nstatic const int $classname$_entries_by_number[] = {\n");
    p_Var2 = &local_90._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var8 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pmVar7 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_c0,(key_type *)(p_Var8 + 1));
        Formatter::operator()
                  (&local_128,"  $1$, // $2$ -> $3$\n",(int *)&p_Var8[1].field_0x4,
                   (int *)(p_Var8 + 1),pmVar7);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var2);
    }
    Formatter::operator()<>(&local_128,"};\n\n");
    iVar5 = anon_unknown_6::CountUniqueValues(this->descriptor_);
    local_138._0_4_ = iVar5;
    Formatter::operator()
              (&local_128,
               "const std::string& $classname$_Name(\n    $classname$ value) {\n  static const bool dummy =\n      ::$proto_ns$::internal::InitializeEnumStrings(\n          $classname$_entries,\n          $classname$_entries_by_number,\n          $1$, $classname$_strings);\n  (void) dummy;\n  int idx = ::$proto_ns$::internal::LookUpEnumName(\n      $classname$_entries,\n      $classname$_entries_by_number,\n      $1$, value);\n  return idx == -1 ? ::$proto_ns$::internal::GetEmptyString() :\n                     $classname$_strings[idx].get();\n}\n"
               ,(int *)&local_138);
    local_138 = (_Base_ptr)CONCAT44(local_138._4_4_,*(undefined4 *)(this->descriptor_ + 4));
    Formatter::operator()
              (&local_128,
               "bool $classname$_Parse(\n    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* value) {\n  int int_value;\n  bool success = ::$proto_ns$::internal::LookUpEnumValue(\n      $classname$_entries, $1$, name, &int_value);\n  if (success) {\n    *value = static_cast<$classname$>(int_value);\n  }\n  return success;\n}\n"
               ,(int *)&local_138);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_f0);
    descriptor = extraout_RDX_01;
  }
  if (*(long *)(this->descriptor_ + 0x18) != 0) {
    ClassName_abi_cxx11_((string *)local_f0,*(cpp **)(this->descriptor_ + 0x18),descriptor);
    Formatter::operator()<>
              (&local_128,
               "#if (__cplusplus < 201703) && (!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n"
              );
    pEVar9 = this->descriptor_;
    if (0 < *(int *)(pEVar9 + 4)) {
      lVar11 = 0;
      lVar12 = 0;
      enum_value = extraout_RDX_02;
      do {
        EnumValueName_abi_cxx11_
                  ((string *)local_c0,(cpp *)(*(long *)(pEVar9 + 0x28) + lVar11),enum_value);
        Formatter::operator()
                  (&local_128,"constexpr $classname$ $1$::$2$;\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   (string *)local_c0);
        enum_value = extraout_RDX_03;
        if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
          operator_delete((void *)local_c0._0_8_);
          enum_value = extraout_RDX_04;
        }
        lVar12 = lVar12 + 1;
        pEVar9 = this->descriptor_;
        lVar11 = lVar11 + 0x20;
      } while (lVar12 < *(int *)(pEVar9 + 4));
    }
    Formatter::operator()
              (&local_128,
               "constexpr $classname$ $1$::$nested_name$_MIN;\nconstexpr $classname$ $1$::$nested_name$_MAX;\n"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    if (this->generate_array_size_ == true) {
      Formatter::operator()
                (&local_128,"constexpr int $1$::$nested_name$_ARRAYSIZE;\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
    }
    Formatter::operator()<>
              (&local_128,
               "#endif  // (__cplusplus < 201703) && (!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n"
              );
    if ((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_) != local_f0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_));
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_128.vars_._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateMethods(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "const ::$proto_ns$::EnumDescriptor* $classname$_descriptor() {\n"
        "  ::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n"
        "  return $file_level_enum_descriptors$[$1$];\n"
        "}\n",
        idx);
  }

  format(
      "bool $classname$_IsValid(int value) {\n"
      "  switch (value) {\n");

  // Multiple values may have the same number.  Make sure we only cover
  // each number once by first constructing a set containing all valid
  // numbers, then printing a case statement for each element.

  std::set<int> numbers;
  for (int j = 0; j < descriptor_->value_count(); j++) {
    const EnumValueDescriptor* value = descriptor_->value(j);
    numbers.insert(value->number());
  }

  for (std::set<int>::iterator iter = numbers.begin(); iter != numbers.end();
       ++iter) {
    format("    case $1$:\n", Int32ToString(*iter));
  }

  format(
      "      return true;\n"
      "    default:\n"
      "      return false;\n"
      "  }\n"
      "}\n"
      "\n");

  if (!HasDescriptorMethods(descriptor_->file(), options_)) {
    // In lite mode (where descriptors are unavailable), we generate separate
    // tables for mapping between enum names and numbers. The _entries table
    // contains the bulk of the data and is sorted by name, while
    // _entries_by_number is sorted by number and just contains pointers into
    // _entries. The two tables allow mapping from name to number and number to
    // name, both in time logarithmic in the number of enum entries. This could
    // probably be made faster, but for now the tables are intended to be simple
    // and compact.
    //
    // Enums with allow_alias = true support multiple entries with the same
    // numerical value. In cases where there are multiple names for the same
    // number, we treat the first name appearing in the .proto file as the
    // canonical one.
    std::map<std::string, int> name_to_number;
    std::map<int, std::string> number_to_canonical_name;
    for (int i = 0; i < descriptor_->value_count(); i++) {
      const EnumValueDescriptor* value = descriptor_->value(i);
      name_to_number.emplace(value->name(), value->number());
      // The same number may appear with multiple names, so we use emplace() to
      // let the first name win.
      number_to_canonical_name.emplace(value->number(), value->name());
    }

    format(
        "static ::$proto_ns$::internal::ExplicitlyConstructed<std::string> "
        "$classname$_strings[$1$] = {};\n\n",
        CountUniqueValues(descriptor_));

    // We concatenate all the names for a given enum into one big string
    // literal. If instead we store an array of string literals, the linker
    // seems to put all enum strings for a given .proto file in the same
    // section, which hinders its ability to strip out unused strings.
    format("static const char $classname$_names[] =");
    for (const auto& p : name_to_number) {
      format("\n  \"$1$\"", p.first);
    }
    format(";\n\n");

    format(
        "static const ::$proto_ns$::internal::EnumEntry $classname$_entries[] "
        "= {\n");
    int i = 0;
    std::map<int, int> number_to_index;
    int data_index = 0;
    for (const auto& p : name_to_number) {
      format("  { {$classname$_names + $1$, $2$}, $3$ },\n", data_index,
             p.first.size(), p.second);
      if (number_to_canonical_name[p.second] == p.first) {
        number_to_index.emplace(p.second, i);
      }
      ++i;
      data_index += p.first.size();
    }

    format(
        "};\n"
        "\n"
        "static const int $classname$_entries_by_number[] = {\n");
    for (const auto& p : number_to_index) {
      format("  $1$, // $2$ -> $3$\n", p.second, p.first,
             number_to_canonical_name[p.first]);
    }
    format(
        "};\n"
        "\n");

    format(
        "const std::string& $classname$_Name(\n"
        "    $classname$ value) {\n"
        "  static const bool dummy =\n"
        "      ::$proto_ns$::internal::InitializeEnumStrings(\n"
        "          $classname$_entries,\n"
        "          $classname$_entries_by_number,\n"
        "          $1$, $classname$_strings);\n"
        "  (void) dummy;\n"
        "  int idx = ::$proto_ns$::internal::LookUpEnumName(\n"
        "      $classname$_entries,\n"
        "      $classname$_entries_by_number,\n"
        "      $1$, value);\n"
        "  return idx == -1 ? ::$proto_ns$::internal::GetEmptyString() :\n"
        "                     $classname$_strings[idx].get();\n"
        "}\n",
        CountUniqueValues(descriptor_));
    format(
        "bool $classname$_Parse(\n"
        "    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* "
        "value) "
        "{\n"
        "  int int_value;\n"
        "  bool success = ::$proto_ns$::internal::LookUpEnumValue(\n"
        "      $classname$_entries, $1$, name, &int_value);\n"
        "  if (success) {\n"
        "    *value = static_cast<$classname$>(int_value);\n"
        "  }\n"
        "  return success;\n"
        "}\n",
        descriptor_->value_count());
  }

  if (descriptor_->containing_type() != NULL) {
    std::string parent = ClassName(descriptor_->containing_type(), false);
    // Before C++17, we must define the static constants which were
    // declared in the header, to give the linker a place to put them.
    // But MSVC++ pre-2015 and post-2017 (version 15.5+) insists that we not.
    format(
        "#if (__cplusplus < 201703) && "
        "(!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n");

    for (int i = 0; i < descriptor_->value_count(); i++) {
      format("constexpr $classname$ $1$::$2$;\n", parent,
             EnumValueName(descriptor_->value(i)));
    }
    format(
        "constexpr $classname$ $1$::$nested_name$_MIN;\n"
        "constexpr $classname$ $1$::$nested_name$_MAX;\n",
        parent);
    if (generate_array_size_) {
      format("constexpr int $1$::$nested_name$_ARRAYSIZE;\n", parent);
    }

    format(
        "#endif  // (__cplusplus < 201703) && "
        "(!defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912))\n");
  }
}